

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

void ImPlot::UpdateAxisColors(int axis_flag,ImPlotAxis *axis)

{
  ImU32 IVar1;
  ImVec4 local_58;
  ImVec4 local_48;
  undefined1 local_38 [8];
  ImVec4 col_grid;
  ImVec4 col_label;
  ImPlotAxis *axis_local;
  int axis_flag_local;
  
  join_0x00001240_0x00001200_ = GetStyleColorVec4(axis_flag);
  _local_38 = GetStyleColorVec4(axis_flag + 1);
  IVar1 = ImGui::GetColorU32((ImVec4 *)local_38);
  axis->ColorMaj = IVar1;
  ImVec4::ImVec4(&local_58,1.0,1.0,1.0,(GImPlot->Style).MinorAlpha);
  local_48 = ::operator*((ImVec4 *)local_38,&local_58);
  IVar1 = ImGui::GetColorU32(&local_48);
  axis->ColorMin = IVar1;
  IVar1 = ImGui::GetColorU32((ImVec4 *)&col_grid.z);
  axis->ColorTxt = IVar1;
  return;
}

Assistant:

void UpdateAxisColors(int axis_flag, ImPlotAxis* axis) {
    const ImVec4 col_label = GetStyleColorVec4(axis_flag);
    const ImVec4 col_grid  = GetStyleColorVec4(axis_flag + 1);
    axis->ColorMaj  = ImGui::GetColorU32(col_grid);
    axis->ColorMin  = ImGui::GetColorU32(col_grid*ImVec4(1,1,1,GImPlot->Style.MinorAlpha));
    axis->ColorTxt = ImGui::GetColorU32(col_label);
}